

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::anon_unknown_0::parse_multilayer_layer_metadata
               (ifstream *file,int min_indent,int *line_idx,
               vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
               *layers)

{
  bool bVar1;
  pair<libaom_examples::ColorProperties,_bool> pVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 uVar5;
  vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_> *in_RCX;
  DepthRepresentationElement in_RDX;
  bool *unaff_retaddr;
  int *in_stack_00000008;
  bool in_stack_00000013;
  int in_stack_00000014;
  ifstream *in_stack_00000018;
  string *in_stack_00000030;
  ParsedValue *in_stack_00000038;
  bool *in_stack_00000040;
  DepthInformation *in_stack_00000050;
  int *in_stack_00000058;
  ColorProperties color_properties;
  LayerMetadata *layer;
  bool layer_has_depth;
  bool layer_has_alpha;
  bool syntax_error;
  ParsedValue value;
  string field_name;
  int indent;
  bool has_list_prefix;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  LayerMetadata *layer_00;
  vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
  *in_stack_fffffffffffffec0;
  FILE *pFVar6;
  int64_t in_stack_fffffffffffffec8;
  ulong in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  pair<libaom_examples::ColorProperties,_bool> local_f9;
  reference local_f0;
  undefined4 local_e4;
  uint in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff29;
  undefined2 in_stack_ffffffffffffff2a;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  AlphaInformation *in_stack_ffffffffffffff70;
  undefined1 uVar7;
  int *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  ifstream *in_stack_ffffffffffffff88;
  undefined1 local_69;
  undefined1 local_68 [24];
  undefined1 local_50 [48];
  DepthRepresentationElement local_20;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar8;
  
  local_50[0x20] = true;
  local_50[0x21] = 0xff;
  local_50[0x22] = 0xff;
  local_50[0x23] = true;
  local_50._40_8_ = in_RCX;
  local_20 = in_RDX;
  std::__cxx11::string::string((string *)local_50);
  ParsedValue::ParsedValue((ParsedValue *)local_68);
  do {
    while( true ) {
      layer_00 = (LayerMetadata *)&local_69;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      __x = (value_type *)local_50;
      bVar1 = parse_line(in_stack_00000018,in_stack_00000014,in_stack_00000013,in_stack_00000008,
                         unaff_retaddr,
                         (int *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         in_stack_00000030,in_stack_00000038,in_stack_00000040);
      if (!bVar1) {
        if ((local_69 & MULTILAYER_LAYER_TYPE_TEXTURE) == MULTILAYER_LAYER_TYPE_UNSPECIFIED) {
          std::
          vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>::
          back((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                *)__lhs);
          validate_layer(layer_00,SUB81((ulong)__lhs >> 0x38,0),SUB81((ulong)__lhs >> 0x30,0));
          bVar8 = 1;
        }
        else {
          bVar8 = 0;
        }
        goto LAB_0012e57b;
      }
      if ((local_50[0x27] & 1) != 0) {
        sVar3 = std::
                vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                        *)local_50._40_8_);
        if (3 < sVar3) {
          fprintf(_stderr,"Error: Too many layers at line %d, the maximum is %d\n",
                  (ulong)*(uint *)local_20,4);
          bVar8 = 0;
          goto LAB_0012e57b;
        }
        bVar1 = std::
                vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                ::empty(in_stack_fffffffffffffec0);
        if (!bVar1) {
          std::
          vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>::
          back((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                *)__lhs);
          validate_layer(layer_00,SUB81((ulong)__lhs >> 0x38,0),SUB81((ulong)__lhs >> 0x30,0));
        }
        sVar3 = std::
                vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                        *)local_50._40_8_);
        if ((sVar3 == 1) &&
           (pvVar4 = std::
                     vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                     ::back((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                             *)__lhs), ((pvVar4->layer_color_description).second & 1U) != 0)) {
          fprintf(_stderr,"Error: layer_color_description cannot be specified for the first layer\n"
                 );
          bVar8 = 0;
          goto LAB_0012e57b;
        }
        local_e4 = 0;
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 & 0xffffff00;
        in_stack_ffffffffffffff24 = 0;
        in_stack_ffffffffffffff28 = 0;
        in_stack_ffffffffffffff29 = 0;
        in_stack_ffffffffffffff2c = 0;
        std::pair<libaom_examples::ColorProperties,_bool>::
        pair<libaom_examples::ColorProperties,_bool,_true>
                  ((pair<libaom_examples::ColorProperties,_bool> *)__lhs);
        in_stack_ffffffffffffff38 = 0;
        in_stack_ffffffffffffff3c = 0;
        in_stack_ffffffffffffff3d = 0;
        in_stack_ffffffffffffff3e = 0;
        in_stack_ffffffffffffff3f = 0;
        std::pair<libaom_examples::ColorProperties,_bool>::
        pair<libaom_examples::ColorProperties,_bool,_true>
                  ((pair<libaom_examples::ColorProperties,_bool> *)__lhs);
        std::pair<libaom_examples::DepthRepresentationElement,_bool>::
        pair<libaom_examples::DepthRepresentationElement,_bool,_true>
                  ((pair<libaom_examples::DepthRepresentationElement,_bool> *)__lhs);
        std::pair<libaom_examples::DepthRepresentationElement,_bool>::
        pair<libaom_examples::DepthRepresentationElement,_bool,_true>
                  ((pair<libaom_examples::DepthRepresentationElement,_bool> *)__lhs);
        std::pair<libaom_examples::DepthRepresentationElement,_bool>::
        pair<libaom_examples::DepthRepresentationElement,_bool,_true>
                  ((pair<libaom_examples::DepthRepresentationElement,_bool> *)__lhs);
        std::pair<libaom_examples::DepthRepresentationElement,_bool>::
        pair<libaom_examples::DepthRepresentationElement,_bool,_true>
                  ((pair<libaom_examples::DepthRepresentationElement,_bool> *)__lhs);
        uVar7 = 0;
        uVar7 = 0;
        std::vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
        ::push_back((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                     *)__lhs,__x);
      }
      bVar1 = std::
              vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ::empty(in_stack_fffffffffffffec0);
      if (bVar1) {
        fprintf(_stderr,"Error: Missing list prefix \'-\' at line %d\n",(ulong)*(uint *)local_20);
        bVar8 = 0;
        goto LAB_0012e57b;
      }
      local_f0 = std::
                 vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                 ::back((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                         *)__lhs);
      bVar1 = std::operator==(__lhs,(char *)__x);
      if (bVar1) break;
      bVar1 = std::operator==(__lhs,(char *)__x);
      if (bVar1) {
        bVar1 = ParsedValue::IntegerValueInRange<bool>
                          ((ParsedValue *)
                           CONCAT17(in_stack_fffffffffffffedf,
                                    CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                           in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                           (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(bool *)layer_00);
        if (!bVar1) {
          bVar8 = 0;
          goto LAB_0012e57b;
        }
      }
      else {
        bVar1 = std::operator==(__lhs,(char *)__x);
        if (bVar1) {
          bVar1 = ParsedValue::IntegerValueInRange<libaom_examples::MultilayerViewType>
                            ((ParsedValue *)
                             CONCAT17(in_stack_fffffffffffffedf,
                                      CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8))
                             ,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                             (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),&layer_00->layer_type);
          if (!bVar1) {
            bVar8 = 0;
            goto LAB_0012e57b;
          }
        }
        else {
          bVar1 = std::operator==(__lhs,(char *)__x);
          if (bVar1) {
            bVar1 = ParsedValue::IntegerValueInRange<unsigned_char>
                              ((ParsedValue *)
                               CONCAT17(in_stack_fffffffffffffedf,
                                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8
                                                )),in_stack_fffffffffffffed0,
                               in_stack_fffffffffffffec8,
                               (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(uchar *)layer_00);
            if (!bVar1) {
              bVar8 = 0;
              goto LAB_0012e57b;
            }
          }
          else {
            bVar1 = std::operator==(__lhs,(char *)__x);
            if (bVar1) {
              bVar1 = ParsedValue::IntegerValueInRange<unsigned_char>
                                ((ParsedValue *)
                                 CONCAT17(in_stack_fffffffffffffedf,
                                          CONCAT16(in_stack_fffffffffffffede,
                                                   in_stack_fffffffffffffed8)),
                                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(uchar *)layer_00);
              if (!bVar1) {
                bVar8 = 0;
                goto LAB_0012e57b;
              }
            }
            else {
              bVar1 = std::operator==(__lhs,(char *)__x);
              if (bVar1) {
                bVar1 = ParsedValue::IntegerValueInRange<libaom_examples::MultilayerMetadataScope>
                                  ((ParsedValue *)
                                   CONCAT17(in_stack_fffffffffffffedf,
                                            CONCAT16(in_stack_fffffffffffffede,
                                                     in_stack_fffffffffffffed8)),
                                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                                   &layer_00->layer_type);
                if (!bVar1) {
                  bVar8 = 0;
                  goto LAB_0012e57b;
                }
              }
              else {
                bVar1 = std::operator==(__lhs,(char *)__x);
                if (bVar1) {
                  bVar1 = parse_color_properties
                                    ((ifstream *)
                                     CONCAT17(in_stack_ffffffffffffff3f,
                                              CONCAT16(in_stack_ffffffffffffff3e,
                                                       CONCAT15(in_stack_ffffffffffffff3d,
                                                                CONCAT14(in_stack_ffffffffffffff3c,
                                                                         in_stack_ffffffffffffff38))
                                                      )),in_stack_ffffffffffffff34,
                                     (int *)CONCAT44(in_stack_ffffffffffffff2c,
                                                     CONCAT22(in_stack_ffffffffffffff2a,
                                                              CONCAT11(in_stack_ffffffffffffff29,
                                                                       in_stack_ffffffffffffff28))),
                                     (ColorProperties *)
                                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
                  if (!bVar1) {
                    bVar8 = 0;
                    goto LAB_0012e57b;
                  }
                  pVar2 = value_present<libaom_examples::ColorProperties>
                                    ((ColorProperties *)layer_00);
                  local_f9.first = pVar2.first;
                  local_f9.second = pVar2.second;
                  std::pair<libaom_examples::ColorProperties,_bool>::operator=
                            (&local_f0->layer_color_description,&local_f9);
                }
                else {
                  bVar1 = std::operator==(__lhs,(char *)__x);
                  if (bVar1) {
                    in_stack_fffffffffffffedf =
                         parse_multilayer_layer_alpha
                                   (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                    in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
                    if (!(bool)in_stack_fffffffffffffedf) {
                      bVar8 = 0;
                      goto LAB_0012e57b;
                    }
                  }
                  else {
                    bVar1 = std::operator==(__lhs,(char *)__x);
                    if (!bVar1) {
                      pFVar6 = _stderr;
                      uVar5 = std::__cxx11::string::c_str();
                      fprintf(pFVar6,"Error: Unknown field %s at line %d\n",uVar5,
                              (ulong)*(uint *)local_20);
                      bVar8 = 0;
                      goto LAB_0012e57b;
                    }
                    in_stack_fffffffffffffede =
                         parse_multilayer_layer_depth
                                   ((ifstream *)layer,(int)color_properties,in_stack_00000058,
                                    in_stack_00000050);
                    if (!(bool)in_stack_fffffffffffffede) {
                      bVar8 = 0;
                      goto LAB_0012e57b;
                    }
                    if ((((local_f0->global_depth_info).d_min.second & 1U) != 0) ||
                       (((local_f0->global_depth_info).d_max.second & 1U) != 0)) {
                      in_stack_fffffffffffffed0 =
                           (ulong)(local_f0->global_depth_info).disparity_ref_view_id;
                      sVar3 = std::
                              vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                              ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                      *)local_50._40_8_);
                      if (in_stack_fffffffffffffed0 == sVar3 - 1) {
                        pFVar6 = _stderr;
                        sVar3 = std::
                                vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                        *)local_50._40_8_);
                        fprintf(pFVar6,
                                "disparity_ref_view_id must be different from the layer\'s id for layer %d (zero-based index)\n"
                                ,(ulong)((int)sVar3 - 1));
                        bVar8 = 0;
                        goto LAB_0012e57b;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar1 = ParsedValue::IntegerValueInRange<libaom_examples::LayerType>
                      ((ParsedValue *)
                       CONCAT17(in_stack_fffffffffffffedf,
                                CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                       (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),&layer_00->layer_type);
  } while (bVar1);
  bVar8 = 0;
LAB_0012e57b:
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(bVar8 & 1);
}

Assistant:

bool parse_multilayer_layer_metadata(std::ifstream &file, int min_indent,
                                     int *line_idx,
                                     std::vector<LayerMetadata> &layers) {
  bool has_list_prefix;
  int indent = -1;
  std::string field_name;
  ParsedValue value;
  bool syntax_error;
  bool layer_has_alpha = false;
  bool layer_has_depth = false;
  while (parse_line(file, min_indent, /*is_list=*/true, &indent,
                    &has_list_prefix, line_idx, &field_name, &value,
                    &syntax_error)) {
    if (has_list_prefix) {
      // Start of a new layer.
      if (layers.size() >= kMaxNumSpatialLayers) {
        fprintf(stderr,
                "Error: Too many layers at line %d, the maximum is %d\n",
                *line_idx, kMaxNumSpatialLayers);
        return false;
      }

      // Validate the previous layer.
      if (!layers.empty()) {
        validate_layer(layers.back(), layer_has_alpha, layer_has_depth);
      }
      if (layers.size() == 1 && layers.back().layer_color_description.second) {
        fprintf(stderr,
                "Error: layer_color_description cannot be specified for the "
                "first layer\n");
        return false;
      }

      layers.push_back({});
      layer_has_alpha = false;
      layer_has_depth = false;
    }
    if (layers.empty()) {
      fprintf(stderr, "Error: Missing list prefix '-' at line %d\n", *line_idx);
      return false;
    }

    LayerMetadata *layer = &layers.back();
    // Check if string starts with field name.
    if ((field_name == "layer_type")) {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/31, *line_idx, &layer->layer_type));
    } else if ((field_name == "luma_plane_only_flag")) {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/1, *line_idx,
                                                &layer->luma_plane_only_flag));
    } else if ((field_name == "layer_view_type")) {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/7, *line_idx, &layer->layer_view_type));
    } else if ((field_name == "group_id")) {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/3, *line_idx,
                                                &layer->group_id));
    } else if ((field_name == "layer_dependency_idc")) {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/7, *line_idx,
                                                &layer->layer_dependency_idc));
    } else if ((field_name == "layer_metadata_scope")) {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/3, *line_idx, &layer->layer_metadata_scope));
    } else if ((field_name == "layer_color_description")) {
      ColorProperties color_properties;
      RETURN_IF_FALSE(
          parse_color_properties(file, indent, line_idx, &color_properties));
      layer->layer_color_description = value_present(color_properties);
    } else if ((field_name == "alpha")) {
      layer_has_alpha = true;
      RETURN_IF_FALSE(parse_multilayer_layer_alpha(
          file,
          /*min_indent=*/indent + 1, line_idx, &layer->global_alpha_info));
    } else if (field_name == "depth") {
      layer_has_depth = true;
      RETURN_IF_FALSE(parse_multilayer_layer_depth(
          file,
          /*min_indent=*/indent + 1, line_idx, &layer->global_depth_info));
      if ((layer->global_depth_info.d_min.second ||
           layer->global_depth_info.d_max.second) &&
          layer->global_depth_info.disparity_ref_view_id ==
              (layers.size() - 1)) {
        fprintf(stderr,
                "disparity_ref_view_id must be different from the layer's id "
                "for layer %d (zero-based index)\n",
                static_cast<int>(layers.size()) - 1);
        return false;
      }
    } else {
      fprintf(stderr, "Error: Unknown field %s at line %d\n",
              field_name.c_str(), *line_idx);
      return false;
    }
  }
  if (syntax_error) return false;
  validate_layer(layers.back(), layer_has_alpha, layer_has_depth);
  return true;
}